

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::MapFind__Impl<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                 *con)

{
  bool bVar1;
  pointer pvVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  const_iterator it;
  ConstraintMap<CondLinConLE> *map;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>,_int>,_true>
  local_30 [2];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>,_int>,_true>
  local_20;
  ConstraintMap<CondLinConLE> *local_18;
  
  local_18 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::GetConstraintMap(in_RDI,(CondLinConLE *)0x0);
  std::
  reference_wrapper<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>const>
  ::
  reference_wrapper<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>const&,void,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>const*>
            ((reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>,_int,_std::hash<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>_>,_std::equal_to<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>,_int>_>_>
       ::find((unordered_map<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>,_int,_std::hash<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>_>,_std::equal_to<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>,_int>_>_>
               *)in_stack_ffffffffffffffb8,(key_type *)0x23ccf9);
  local_30[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>,_int,_std::hash<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>_>,_std::equal_to<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>,_int>_>_>
       ::end((unordered_map<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>,_int,_std::hash<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>_>,_std::equal_to<std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>,_int>_>_>
              *)in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator!=(local_30,&local_20);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>,_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::reference_wrapper<const_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>,_int>,_false,_true>
                           *)0x23cd2c);
    iVar3 = pvVar2->second;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int MapFind__Impl(const Constraint& con) {
    const auto& map = GET_CONST_CONSTRAINT_MAP(Constraint);
    auto it = map.find( con );
    return (map.end() != it) ? it->second : -1;
  }